

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UBool __thiscall
icu_63::RuleBasedNumberFormat::operator==(RuleBasedNumberFormat *this,Format *other)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  bool local_4a;
  uint local_48;
  uint local_44;
  long *local_38;
  NFRuleSet **q;
  NFRuleSet **p;
  RuleBasedNumberFormat *rhs;
  Format *other_local;
  RuleBasedNumberFormat *this_local;
  
  if (this == (RuleBasedNumberFormat *)other) {
    this_local._7_1_ = '\x01';
  }
  else {
    if (this == (RuleBasedNumberFormat *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator==
                      ((type_info *)
                       (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[-1],
                       (type_info *)(other->super_UObject)._vptr_UObject[-1]);
    if (((bVar1) &&
        (UVar2 = Locale::operator==(&this->locale,(Locale *)(other[1].actualLocale + 0x38)),
        UVar2 != '\0')) && (this->lenient == other[1].field_0x144)) {
      if (this->localizations == (LocalizationInfo *)0x0) {
        local_44 = (uint)(*(long *)other[2].actualLocale == 0);
      }
      else {
        if (*(long *)other[2].actualLocale == 0) {
          local_48 = 0;
        }
        else {
          iVar3 = (*this->localizations->_vptr_LocalizationInfo[2])
                            (this->localizations,*(undefined8 *)other[2].actualLocale);
          local_48 = (uint)(char)iVar3;
        }
        local_44 = local_48;
      }
      if (local_44 != 0) {
        q = this->fRuleSets;
        local_38 = *(long **)(other[1].actualLocale + 0x18);
        if (q == (NFRuleSet **)0x0) {
          return local_38 == (long *)0x0;
        }
        if (local_38 == (long *)0x0) {
          return '\0';
        }
        while( true ) {
          bVar1 = false;
          if ((*q != (NFRuleSet *)0x0) && (bVar1 = false, *local_38 != 0)) {
            UVar2 = NFRuleSet::operator==(*q,(NFRuleSet *)*local_38);
            bVar1 = UVar2 != '\0';
          }
          if (!bVar1) break;
          q = q + 1;
          local_38 = local_38 + 1;
        }
        local_4a = false;
        if (*local_38 == 0) {
          local_4a = *q == (NFRuleSet *)0x0;
        }
        return local_4a;
      }
    }
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
RuleBasedNumberFormat::operator==(const Format& other) const
{
    if (this == &other) {
        return TRUE;
    }

    if (typeid(*this) == typeid(other)) {
        const RuleBasedNumberFormat& rhs = (const RuleBasedNumberFormat&)other;
        // test for capitalization info equality is adequately handled
        // by the NumberFormat test for fCapitalizationContext equality;
        // the info here is just derived from that.
        if (locale == rhs.locale &&
            lenient == rhs.lenient &&
            (localizations == NULL 
                ? rhs.localizations == NULL 
                : (rhs.localizations == NULL 
                    ? FALSE
                    : *localizations == rhs.localizations))) {

            NFRuleSet** p = fRuleSets;
            NFRuleSet** q = rhs.fRuleSets;
            if (p == NULL) {
                return q == NULL;
            } else if (q == NULL) {
                return FALSE;
            }
            while (*p && *q && (**p == **q)) {
                ++p;
                ++q;
            }
            return *q == NULL && *p == NULL;
        }
    }

    return FALSE;
}